

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

bblist * listbigfile_r(char *basename,char *blockname,bblist *bblist)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *basename_00;
  size_t sVar4;
  dirent **ppdVar5;
  bblist *n_1;
  char *fullpath1;
  char *blockname1;
  char *current;
  int i;
  int n;
  dirent **namelist;
  bblist *bblist_local;
  char *blockname_local;
  char *basename_local;
  
  namelist = (dirent **)bblist;
  bblist_local = (bblist *)blockname;
  blockname_local = basename;
  pcVar3 = _path_join(basename,blockname);
  iVar1 = scandir(pcVar3,(dirent ***)&i,filter,_alphasort);
  free(pcVar3);
  if (iVar1 < 0) {
    basename_local = (char *)namelist;
  }
  else {
    for (current._0_4_ = 0; (int)current < iVar1; current._0_4_ = (int)current + 1) {
      pcVar3 = _path_join((char *)bblist_local,_i[(int)current]->d_name);
      basename_00 = _path_join(blockname_local,pcVar3);
      iVar2 = _big_file_path_is_block(basename_00);
      if (iVar2 == 0) {
        namelist = (dirent **)listbigfile_r(blockname_local,pcVar3,(bblist *)namelist);
      }
      else {
        sVar4 = strlen(pcVar3);
        ppdVar5 = (dirent **)malloc(sVar4 + 0x11);
        *ppdVar5 = (dirent *)namelist;
        ppdVar5[1] = (dirent *)(ppdVar5 + 2);
        strcpy((char *)ppdVar5[1],pcVar3);
        namelist = ppdVar5;
      }
      free(basename_00);
      free(pcVar3);
      free(_i[(int)current]);
    }
    free(_i);
    basename_local = (char *)namelist;
  }
  return (bblist *)basename_local;
}

Assistant:

static struct
bblist * listbigfile_r(const char * basename, char * blockname, struct bblist * bblist) {
    struct dirent **namelist;
    int n;
    int i;

    char * current;
    current = _path_join(basename, blockname);

    n = scandir(current, &namelist, filter, _alphasort);
    free(current);
    if (n < 0)
        return bblist;

    for(i = 0; i < n ; i ++) {
        char * blockname1 = _path_join(blockname, namelist[i]->d_name);
        char * fullpath1 = _path_join(basename, blockname1);
        if(_big_file_path_is_block(fullpath1)) {
            struct bblist * n = malloc(sizeof(struct bblist) + strlen(blockname1) + 1);
            n->next = bblist;
            n->blockname = (char*) &n[1];
            strcpy(n->blockname, blockname1);
            bblist = n;
        } else {
            bblist = listbigfile_r(basename, blockname1, bblist);
        }
        free(fullpath1);
        free(blockname1);
        free(namelist[i]);
    }
    free(namelist);
    return bblist;
}